

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::GetLineFromStream
               (istream *is,string *line,bool *has_newline,size_type sizeLimit)

{
  byte bVar1;
  ulong uVar2;
  char *pcVar3;
  byte local_32;
  bool haveData;
  size_type sizeLimit_local;
  bool *has_newline_local;
  string *line_local;
  istream *is_local;
  
  std::__cxx11::string::operator=((string *)line,"");
  uVar2 = std::ios::operator!((ios *)(is + *(long *)(*(long *)is + -0x18)));
  if ((uVar2 & 1) == 0) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>(is,(string *)line);
    bVar1 = std::__cxx11::string::empty();
    local_32 = 1;
    if ((bVar1 & 1) != 0) {
      local_32 = std::ios::eof();
      local_32 = local_32 ^ 0xff;
    }
    is_local._7_1_ = (bool)(local_32 & 1);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      pcVar3 = (char *)std::__cxx11::string::back();
      if (*pcVar3 == '\r') {
        std::__cxx11::string::size();
        std::__cxx11::string::resize((ulong)line);
      }
      if ((sizeLimit != 0xffffffffffffffff) &&
         (uVar2 = std::__cxx11::string::size(), sizeLimit < uVar2)) {
        std::__cxx11::string::resize((ulong)line);
      }
    }
    if (has_newline != (bool *)0x0) {
      bVar1 = std::ios::eof();
      *has_newline = (bool)((bVar1 ^ 0xff) & 1);
    }
  }
  else {
    if (has_newline != (bool *)0x0) {
      *has_newline = false;
    }
    is_local._7_1_ = false;
  }
  return is_local._7_1_;
}

Assistant:

bool SystemTools::GetLineFromStream(
  std::istream& is, std::string& line, bool* has_newline /* = 0 */,
  std::string::size_type sizeLimit /* = std::string::npos */)
{
  // Start with an empty line.
  line = "";

  // Early short circuit return if stream is no good. Just return
  // false and the empty line. (Probably means caller tried to
  // create a file stream with a non-existent file name...)
  //
  if (!is) {
    if (has_newline) {
      *has_newline = false;
    }
    return false;
  }

  std::getline(is, line);
  bool haveData = !line.empty() || !is.eof();
  if (!line.empty()) {
    // Avoid storing a carriage return character.
    if (line.back() == '\r') {
      line.resize(line.size() - 1);
    }

    // if we read too much then truncate the buffer
    if (sizeLimit != std::string::npos && line.size() > sizeLimit) {
      line.resize(sizeLimit);
    }
  }

  // Return the results.
  if (has_newline) {
    *has_newline = !is.eof();
  }
  return haveData;
}